

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramid.cc
# Opt level: O1

void __thiscall
ParamMeasure::walkforward(ParamMeasure *this,WalkState *state,PcodeOp *ignoreop,Varnode *vn)

{
  OpCode OVar1;
  PcodeOp *pPVar2;
  pointer ppVVar3;
  ParamRank PVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ParamRank PVar9;
  ParamRank PVar10;
  _List_node_base *p_Var11;
  ulong uVar12;
  ulong uVar13;
  
  iVar6 = state->depth;
  state->depth = iVar6 + 1;
  if (iVar6 < 9) {
    p_Var11 = (vn->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
              super__List_node_base._M_next;
    PVar4 = this->rank;
    if (p_Var11 != (_List_node_base *)&vn->descend && PVar4 != state->terminalrank) {
      do {
        pPVar2 = (PcodeOp *)p_Var11[1]._M_next;
        if (pPVar2 == ignoreop) goto LAB_0030cd9e;
        OVar1 = pPVar2->opcode->opcode;
        switch(OVar1) {
        case CPUI_BRANCH:
        case CPUI_BRANCHIND:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar5 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if (0 < (int)uVar5) {
            uVar7 = 0;
            do {
              if (ppVVar3[uVar7] == vn) {
                if (uVar7 == 0) goto switchD_0030cbea_caseD_9;
                break;
              }
              uVar7 = uVar7 + 1;
            } while ((uVar5 & 0x7fffffff) != uVar7);
            goto LAB_0030cd9e;
          }
        case CPUI_CALLOTHER:
switchD_0030cbea_caseD_9:
          PVar10 = this->rank;
          if (2 < (int)PVar4) {
            PVar10 = DIRECTREAD;
          }
          PVar9 = this->rank;
          if ((int)PVar4 < 2) {
            PVar9 = DIRECTREAD;
          }
          break;
        case CPUI_CBRANCH:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar5 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          else {
            uVar7 = 0;
            do {
              if (ppVVar3[uVar7] == vn) {
                uVar5 = (uint)uVar7;
                break;
              }
              uVar7 = uVar7 + 1;
            } while ((uVar5 & 0x7fffffff) != uVar7);
          }
          if (1 < (int)uVar5) goto LAB_0030cd9e;
          goto switchD_0030cbea_caseD_9;
        case CPUI_CALL:
        case CPUI_CALLIND:
          ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar5 = (uint)((ulong)((long)(pPVar2->inrefs).
                                       super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3) >>
                        3);
          if ((int)uVar5 < 1) goto switchD_0030cbea_caseD_9;
          uVar7 = 0;
          do {
            if (ppVVar3[uVar7] == vn) {
              if (uVar7 == 0) goto switchD_0030cbea_caseD_9;
              break;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar5 & 0x7fffffff) != uVar7);
          this->numcalls = this->numcalls + 1;
          PVar10 = this->rank;
          if (4 < (int)PVar4) {
            PVar10 = SUBFNPARAM;
          }
          PVar9 = this->rank;
          if ((int)PVar4 < 4) {
            PVar9 = SUBFNPARAM;
          }
          break;
        case CPUI_RETURN:
          PVar10 = this->rank;
          if (5 < (int)PVar4) {
            PVar10 = SUBFNRETURN;
          }
          PVar9 = this->rank;
          if ((int)PVar4 < 5) {
            PVar9 = SUBFNRETURN;
          }
          break;
        default:
          if (OVar1 == CPUI_MULTIEQUAL) {
            ppVVar3 = (pPVar2->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar7 = (ulong)((long)(pPVar2->inrefs).
                                  super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)ppVVar3) >> 3;
            uVar5 = (uint)uVar7;
            if ((int)uVar5 < 1) {
              lVar8 = 0;
            }
            else {
              uVar12 = 0;
              do {
                uVar13 = uVar12;
                if (ppVVar3[uVar12] == vn) break;
                uVar12 = uVar12 + 1;
                uVar13 = uVar7;
              } while ((uVar5 & 0x7fffffff) != uVar12);
              lVar8 = (long)(int)uVar13;
            }
            if (((pPVar2->parent->super_FlowBlock).intothis.
                 super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8].label & 2) == 0) {
              walkforward(this,state,(PcodeOp *)0x0,pPVar2->output);
            }
            goto LAB_0030cd9e;
          }
          if (OVar1 != CPUI_INDIRECT) goto switchD_0030cbea_caseD_9;
          PVar10 = this->rank;
          if (6 < (int)PVar4) {
            PVar10 = INDIRECT;
          }
          PVar9 = this->rank;
          if ((int)PVar4 < 6) {
            PVar9 = INDIRECT;
          }
        }
        if (state->best != false) {
          PVar9 = PVar10;
        }
        this->rank = PVar9;
LAB_0030cd9e:
        PVar4 = this->rank;
      } while ((PVar4 != state->terminalrank) &&
              (p_Var11 = p_Var11->_M_next, p_Var11 != (_List_node_base *)&vn->descend));
    }
    iVar6 = state->depth + -1;
  }
  state->depth = iVar6;
  return;
}

Assistant:

void ParamMeasure::walkforward( WalkState &state, PcodeOp *ignoreop, Varnode *vn )

{
  state.depth += 1;
  if (state.depth >= MAXDEPTH) {
    state.depth -= 1;
    return;
  }
  list<PcodeOp *>::const_iterator iter = vn->beginDescend();
  while( rank != state.terminalrank && iter != vn->endDescend() ) {
    PcodeOp *op = *iter;
    if( op != ignoreop ) {
      OpCode oc = op->getOpcode()->getOpcode();
      switch( oc ) {
      case CPUI_BRANCH:
      case CPUI_BRANCHIND:
	if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
	break;
      case CPUI_CBRANCH:
        if( op->getSlot(vn) < 2 ) updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_CALL:
      case CPUI_CALLIND:
        if( op->getSlot(vn) == 0 ) updaterank( DIRECTREAD, state.best );
        else {
          numcalls++;
          updaterank( SUBFNPARAM, state.best );
        }
        break;
      case CPUI_CALLOTHER:
        updaterank( DIRECTREAD, state.best );
        break;
      case CPUI_RETURN:
        updaterank( THISFNRETURN, state.best );
        break;
      case CPUI_INDIRECT:
        updaterank( INDIRECT, state.best );
        break;
      case CPUI_MULTIEQUAL:
        // The only op for which there can be a loop in the graph is with the MULTIEQUAL (not for CALL, etc.).
        // Walk forward only if the path is not part of a loop.
        if( !op->getParent()->isLoopIn(op->getSlot(vn)) ) walkforward( state, (PcodeOp *)0, op->getOut() );
        break;
      default:
        updaterank( DIRECTREAD, state.best );
        break;
      }
    }
    iter++;
  }
  state.depth -= 1;
}